

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O2

Pla_Man_t * Pla_ManPrimesDetector(int nVars)

{
  Vec_Int_t *vMints;
  Pla_Man_t *pPVar1;
  char pName [1000];
  char acStack_408 [1008];
  
  vMints = Pla_GenPrimes(nVars);
  sprintf(acStack_408,"primes%02d",nVars);
  pPVar1 = Pla_GenFromMinterms(acStack_408,vMints,nVars);
  free(vMints->pArray);
  free(vMints);
  return pPVar1;
}

Assistant:

Pla_Man_t * Pla_ManPrimesDetector( int nVars )
{
    char pName[1000];
    Pla_Man_t * p;
    Vec_Int_t * vMints = Pla_GenPrimes( nVars );
    sprintf( pName, "primes%02d", nVars );
    p = Pla_GenFromMinterms( pName, vMints, nVars );
    Vec_IntFree( vMints );
    return p;
}